

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::clear(Graph *this)

{
  bool bVar1;
  reference pCVar2;
  reference pEVar3;
  Edge *e;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range1_1;
  Colors *c;
  iterator __end1;
  iterator __begin1;
  vector<Graph::Colors,_std::allocator<Graph::Colors>_> *__range1;
  Graph *this_local;
  
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::clear(&this->bridges);
  __end1 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::begin(&this->colorMap);
  c = (Colors *)std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::end(&this->colorMap);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Graph::Colors_*,_std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>_>
                                *)&c);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<Graph::Colors_*,_std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>_>
             ::operator*(&__end1);
    *pCVar2 = White;
    __gnu_cxx::
    __normal_iterator<Graph::Colors_*,_std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin(&this->edges);
  e = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end(&this->edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                        *)&e);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
             ::operator*(&__end1_1);
    pEVar3->finished = false;
    __gnu_cxx::
    __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void Graph::clear() {
    bridges.clear();
    for (auto &c : colorMap)
        c = Colors::White;
    for (auto &e : edges)
        e.finished = false;
}